

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall
vkt::sr::ShaderRenderCaseInstance::setupUniformData
          (ShaderRenderCaseInstance *this,deUint32 bindingLocation,size_t size,void *dataPtr)

{
  undefined1 *this_00;
  Allocator *pAVar1;
  deUint64 dVar2;
  PtrData<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
  data;
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  VkResult result;
  VkDevice device;
  DeviceInterface *vk_00;
  Handle<(vk::HandleType)8> *pHVar3;
  Allocation *pAVar4;
  VkDeviceMemory VVar5;
  VkDeviceSize VVar6;
  void *dst;
  BufferUniform *pBVar7;
  Unique<vk::Handle<(vk::HandleType)8>_> *this_01;
  UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
  *this_02;
  SharedPtr<vk::Allocation> *other;
  SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
  local_178;
  SharedPtr<vk::Allocation> local_168;
  RefData<vk::Handle<(vk::HandleType)8>_> local_158;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> local_138;
  deUint64 local_128;
  VkDescriptorBufferInfo local_120;
  DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform> local_101;
  undefined1 local_100 [8];
  MovePtr<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
  uniformInfo;
  VkMemoryRequirements local_c0;
  undefined1 local_a8 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> alloc;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  VkBufferCreateInfo uniformBufferParams;
  deUint32 queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice vkDevice;
  void *dataPtr_local;
  size_t size_local;
  deUint32 bindingLocation_local;
  ShaderRenderCaseInstance *this_local;
  
  device = getDevice(this);
  vk_00 = getDeviceInterface(this);
  uniformBufferParams.pQueueFamilyIndices._4_4_ = getUniversalQueueFamilyIndex(this);
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._0_4_ = 0xc;
  uniformBufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  uniformBufferParams._4_4_ = 0;
  uniformBufferParams.pNext._0_4_ = 0;
  uniformBufferParams.size._0_4_ = 0x10;
  uniformBufferParams.size._4_4_ = 0;
  uniformBufferParams.usage = 1;
  uniformBufferParams._40_8_ = (long)&uniformBufferParams.pQueueFamilyIndices + 4;
  this_00 = &alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
             field_0x8;
  uniformBufferParams._16_8_ = size;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)this_00,vk_00,device,
                     (VkBufferCreateInfo *)
                     &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                      m_allocator,(VkAllocationCallbacks *)0x0);
  pAVar1 = this->m_memAlloc;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)this_00);
  ::vk::getBufferMemoryRequirements(&local_c0,vk_00,device,(VkBuffer)pHVar3->m_internal);
  (*pAVar1->_vptr_Allocator[3])
            (local_a8,pAVar1,&local_c0,(ulong)::vk::MemoryRequirement::HostVisible);
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                      &alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                       m_data.field_0x8);
  dVar2 = pHVar3->m_internal;
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_a8);
  VVar5 = ::vk::Allocation::getMemory(pAVar4);
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_a8);
  VVar6 = ::vk::Allocation::getOffset(pAVar4);
  result = (*vk_00->_vptr_DeviceInterface[0xc])(vk_00,device,dVar2,VVar5.m_internal,VVar6);
  ::vk::checkResult(result,
                    "vk.bindBufferMemory(vkDevice, *buffer, alloc->getMemory(), alloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x32b);
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_a8);
  dst = ::vk::Allocation::getHostPtr(pAVar4);
  ::deMemcpy(dst,dataPtr,size);
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_a8);
  uniformInfo.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
  .m_data._8_8_ = ::vk::Allocation::getMemory(pAVar4);
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_a8);
  VVar6 = ::vk::Allocation::getOffset(pAVar4);
  ::vk::flushMappedMemoryRange
            (vk_00,device,
             (VkDeviceMemory)
             uniformInfo.
             super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
             .m_data._8_8_,VVar6,size);
  pBVar7 = (BufferUniform *)operator_new(0x48);
  BufferUniform::BufferUniform(pBVar7);
  de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>::DefaultDeleter(&local_101);
  de::details::
  MovePtr<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
  ::MovePtr((MovePtr<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
             *)local_100,pBVar7);
  pBVar7 = de::details::
           UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
           ::operator->((UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
                         *)local_100);
  (pBVar7->super_UniformInfo).type = VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                      &alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                       m_data.field_0x8);
  local_128 = pHVar3->m_internal;
  ::vk::makeDescriptorBufferInfo(&local_120,(VkBuffer)local_128,0,size);
  pBVar7 = de::details::
           UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
           ::operator->((UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
                         *)local_100);
  (pBVar7->descriptor).range = local_120.range;
  (pBVar7->descriptor).buffer.m_internal = local_120.buffer.m_internal;
  (pBVar7->descriptor).offset = local_120.offset;
  pBVar7 = de::details::
           UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
           ::operator->((UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
                         *)local_100);
  (pBVar7->super_UniformInfo).location = bindingLocation;
  this_01 = (Unique<vk::Handle<(vk::HandleType)8>_> *)operator_new(0x20);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_158,
             (Move *)&alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                      m_data.field_0x8);
  data_00.deleter.m_deviceIface = local_158.deleter.m_deviceIface;
  data_00.object.m_internal = local_158.object.m_internal;
  data_00.deleter.m_device = local_158.deleter.m_device;
  data_00.deleter.m_allocator = local_158.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique(this_01,data_00);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::SharedPtr
            (&local_138,this_01);
  pBVar7 = de::details::
           UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
           ::operator->((UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
                         *)local_100);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::operator=
            (&pBVar7->buffer,&local_138);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::~SharedPtr(&local_138);
  pAVar4 = de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::release
                     ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_a8);
  de::SharedPtr<vk::Allocation>::SharedPtr(&local_168,pAVar4);
  pBVar7 = de::details::
           UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
           ::operator->((UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
                         *)local_100);
  other = &local_168;
  de::SharedPtr<vk::Allocation>::operator=(&pBVar7->alloc,other);
  de::SharedPtr<vk::Allocation>::~SharedPtr(&local_168);
  this_02 = (UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
             *)operator_new(0x10);
  de::details::MovePtr::operator_cast_to_PtrData
            ((PtrData<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
              *)local_100,(MovePtr *)other);
  data._8_8_ = local_158.deleter.m_deviceIface;
  data.ptr = (UniformInfo *)local_158.object.m_internal;
  de::details::
  UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
  ::UniquePtr(this_02,data);
  de::
  SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
  ::SharedPtr(&local_178,this_02);
  std::
  vector<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>_>_>
  ::push_back(&this->m_uniformInfos,&local_178);
  de::
  SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
  ::~SharedPtr(&local_178);
  de::details::
  MovePtr<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
  ::~MovePtr((MovePtr<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
              *)local_100);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_a8);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
              field_0x8);
  return;
}

Assistant:

void ShaderRenderCaseInstance::setupUniformData (deUint32 bindingLocation, size_t size, const void* dataPtr)
{
	const VkDevice					vkDevice			= getDevice();
	const DeviceInterface&			vk					= getDeviceInterface();
	const deUint32					queueFamilyIndex	= getUniversalQueueFamilyIndex();

	const VkBufferCreateInfo		uniformBufferParams	=
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
		DE_NULL,									// const void*			pNext;
		0u,											// VkBufferCreateFlags	flags;
		size,										// VkDeviceSize			size;
		VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT,			// VkBufferUsageFlags	usage;
		VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
		1u,											// deUint32				queueFamilyCount;
		&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
	};

	Move<VkBuffer>					buffer				= createBuffer(vk, vkDevice, &uniformBufferParams);
	de::MovePtr<Allocation>			alloc				= m_memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *buffer), MemoryRequirement::HostVisible);
	VK_CHECK(vk.bindBufferMemory(vkDevice, *buffer, alloc->getMemory(), alloc->getOffset()));

	deMemcpy(alloc->getHostPtr(), dataPtr, size);
	flushMappedMemoryRange(vk, vkDevice, alloc->getMemory(), alloc->getOffset(), size);

	de::MovePtr<BufferUniform> uniformInfo(new BufferUniform());
	uniformInfo->type = VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER;
	uniformInfo->descriptor = makeDescriptorBufferInfo(*buffer, 0u, size);
	uniformInfo->location = bindingLocation;
	uniformInfo->buffer = VkBufferSp(new vk::Unique<VkBuffer>(buffer));
	uniformInfo->alloc = AllocationSp(alloc.release());

	m_uniformInfos.push_back(UniformInfoSp(new de::UniquePtr<UniformInfo>(uniformInfo)));
}